

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O2

void gimage::collapseLaplacianPyramid<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               *p)

{
  pointer pIVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int j;
  long lVar9;
  pointer a;
  long i;
  long lVar10;
  long lVar11;
  float *pfVar12;
  long k;
  float fVar13;
  
  a = (p->
      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (p->
           super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = ((long)pIVar1 - (long)a) / 0x38;
  if (pIVar1 == a) {
    return;
  }
  if (1 < uVar5) {
    for (uVar4 = (int)uVar5 - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      lVar2 = a[uVar4].width;
      lVar3 = a[uVar4].height;
      lVar6 = lVar3 + -2;
      lVar8 = 0;
      if (0 < lVar6) {
        lVar8 = lVar6;
      }
      lVar7 = 0;
      if (0 < lVar2) {
        lVar7 = lVar2;
      }
      for (lVar9 = 0; lVar9 < a[uVar4].depth; lVar9 = lVar9 + 1) {
        pfVar12 = *a[uVar4].img[lVar9];
        for (uVar5 = 0; (j = (int)lVar9, uVar5 < 2 && ((long)uVar5 < lVar3)); uVar5 = uVar5 + 1) {
          for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
            fVar13 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,lVar10
                                ,uVar5,j);
            *pfVar12 = fVar13 + *pfVar12;
            pfVar12 = pfVar12 + 1;
          }
        }
        for (lVar10 = 2; lVar11 = lVar8, lVar10 < lVar6; lVar10 = lVar10 + 1) {
          if (0 < lVar2) {
            fVar13 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,0,
                                lVar10,j);
            *pfVar12 = fVar13 + *pfVar12;
            if (lVar2 == 1) {
              pfVar12 = pfVar12 + 1;
            }
            else {
              fVar13 = expandGaussPixel<float>
                                 ((p->
                                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,1,
                                  lVar10,j);
              pfVar12[1] = fVar13 + pfVar12[1];
              pfVar12 = pfVar12 + 2;
            }
          }
          for (lVar11 = 2; lVar11 < lVar2 + -2; lVar11 = lVar11 + 1) {
            fVar13 = expandGaussPixelInner<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,lVar11
                                ,lVar10,j);
            *pfVar12 = fVar13 + *pfVar12;
            pfVar12 = pfVar12 + 1;
          }
          if (2 < lVar2) {
            fVar13 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,
                                lVar2 + -2,lVar10,j);
            *pfVar12 = fVar13 + *pfVar12;
            if (lVar2 == 3) {
              pfVar12 = pfVar12 + 1;
            }
            else {
              fVar13 = expandGaussPixel<float>
                                 ((p->
                                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,
                                  lVar2 + -1,lVar10,j);
              pfVar12[1] = fVar13 + pfVar12[1];
              pfVar12 = pfVar12 + 2;
            }
          }
        }
        for (; lVar11 < lVar3; lVar11 = lVar11 + 1) {
          for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
            fVar13 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar4 + 1,lVar10
                                ,lVar11,j);
            *pfVar12 = fVar13 + *pfVar12;
            pfVar12 = pfVar12 + 1;
          }
        }
        a = (p->
            super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setImageLimited<float>(image,a);
  return;
}

Assistant:

void collapseLaplacianPyramid(Image<T> &image, std::vector<ImageFloat> &p)
{
  if (p.size() < 1) return; // there is no pyramid

  if (p.size() >= 2) // there must be at least two levels for collapsing
  {
    // collapse from highest to lowest level

    for (int l=static_cast<int>(p.size())-2; l>=0; l--)
    {
      // add expanded image of lower level

      const long w=p[l].getWidth();
      const long h=p[l].getHeight();

      // for all color channels

      for (int d=0; d<p[l].getDepth(); d++)
      {
        float *px=p[l].getPtr(0, 0, d);
        for (long k=0; k<2 && k<h; k++)
        {
          for (long i=0; i<w; i++)
          {
            *px++ +=expandGaussPixel(p[l+1], i, k, d);
          }
        }

        for (long k=2; k<h-2; k++)
        {
          if (w > 0) *px++ +=expandGaussPixel(p[l+1], 0, k, d);
          if (w > 1) *px++ +=expandGaussPixel(p[l+1], 1, k, d);

          for (long i=2; i<w-2; i++)
          {
            *px++ +=expandGaussPixelInner(p[l+1], i, k, d);
          }

          if (w > 2) *px++ +=expandGaussPixel(p[l+1], w-2, k, d);
          if (w > 3) *px++ +=expandGaussPixel(p[l+1], w-1, k, d);
        }

        for (long k=std::max(0l, h-2); k<h; k++)
        {
          for (long i=0; i<w; i++)
          {
            *px++ +=expandGaussPixel(p[l+1], i, k, d);
          }
        }
      }
    }
  }

  // image at level 0 is result

  image.setImageLimited(p[0]);
}